

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O1

MatrixXd * __thiscall OpenNN::Layer::to_matrix_derivated(Layer *this)

{
  double dVar1;
  DenseStorage<double,__1,__1,__1,_0> *this_00;
  pointer ppNVar2;
  long size;
  ulong uVar3;
  
  this_00 = (DenseStorage<double,__1,__1,__1,_0> *)operator_new(0x18);
  size = (long)(this->neurons).
               super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->neurons).
               super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
  this_00->m_data = (double *)0x0;
  this_00->m_rows = 0;
  this_00->m_cols = 0;
  if (size < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this_00,size,1,size);
  ppNVar2 = (this->neurons).super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->neurons).super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppNVar2) {
    uVar3 = 0;
    do {
      dVar1 = Neuron::get_derivated_value(ppNVar2[uVar3]);
      if ((this_00->m_rows < 1) || (this_00->m_cols <= (long)uVar3)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      this_00->m_data[this_00->m_rows * uVar3] = dVar1;
      uVar3 = uVar3 + 1;
      ppNVar2 = (this->neurons).
                super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->neurons).
                                   super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3))
    ;
  }
  return (MatrixXd *)this_00;
}

Assistant:

Eigen::MatrixXd* OpenNN::Layer::to_matrix_derivated()
{
    Eigen::MatrixXd* matrix = new Eigen::MatrixXd(1, this->neurons.size());
    for (int i = 0; i < this->neurons.size(); i++) {
        (*matrix)(0, i) = this->neurons.at(i)->get_derivated_value();
    }
    return matrix;
}